

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int run_test_ipc_listen_after_write(void)

{
  undefined1 auVar1 [16];
  int extraout_EAX;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  long *extraout_RDX;
  long *__n;
  code **ppcVar5;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_70 [16];
  undefined8 uStack_60;
  long lStack_28;
  code *apcStack_20 [2];
  ulong local_10;
  undefined8 local_8;
  
  apcStack_20[0] = (code *)0x1a9995;
  run_ipc_test("ipc_helper_listen_after_write",on_read);
  local_8 = 1;
  local_10 = (ulong)local_conn_accepted;
  if (local_10 == 1) {
    local_8 = 1;
    local_10 = (ulong)remote_conn_accepted;
    if (local_10 != 1) goto LAB_001a9a2f;
    local_8 = 1;
    local_10 = (ulong)read_cb_called;
    if (local_10 != 1) goto LAB_001a9a3e;
    local_8 = 1;
    local_10 = (ulong)exit_cb_called;
    if (local_10 == 1) {
      return 0;
    }
  }
  else {
    apcStack_20[0] = (code *)0x1a9a2f;
    run_test_ipc_listen_after_write_cold_1();
LAB_001a9a2f:
    apcStack_20[0] = (code *)0x1a9a3e;
    run_test_ipc_listen_after_write_cold_2();
LAB_001a9a3e:
    apcStack_20[0] = (code *)0x1a9a4d;
    run_test_ipc_listen_after_write_cold_3();
  }
  apcStack_20[0] = run_test_ipc_tcp_connection;
  run_test_ipc_listen_after_write_cold_4();
  run_ipc_test("ipc_helper_tcp_connection",on_read_connection);
  apcStack_20[0] = (code *)0x1;
  lStack_28 = (long)read_cb_called;
  if (lStack_28 == 1) {
    apcStack_20[0] = (code *)0x1;
    lStack_28 = (long)tcp_write_cb_called;
    if (lStack_28 != 1) goto LAB_001a9b0d;
    apcStack_20[0] = (code *)0x1;
    lStack_28 = (long)tcp_read_cb_called;
    if (lStack_28 != 1) goto LAB_001a9b1c;
    apcStack_20[0] = (code *)0x1;
    lStack_28 = (long)exit_cb_called;
    if (lStack_28 == 1) {
      return 0;
    }
  }
  else {
    run_test_ipc_tcp_connection_cold_1();
LAB_001a9b0d:
    run_test_ipc_tcp_connection_cold_2();
LAB_001a9b1c:
    run_test_ipc_tcp_connection_cold_3();
  }
  ppcVar5 = apcStack_20;
  __n = &lStack_28;
  run_test_ipc_tcp_connection_cold_4();
  auVar1._8_8_ = auStack_70._8_8_;
  auVar1._0_8_ = auStack_70._0_8_;
  if (__n == (long *)0x0) {
LAB_001a9b61:
    free((void *)*extraout_RDX);
    return extraout_EAX;
  }
  if ((long)__n < 0) {
    auStack_70 = auVar1;
    if (__n != (long *)0xfffffffffffff001) {
LAB_001a9d4b:
      uVar4 = uv_strerror((ulong)__n & 0xffffffff);
      printf("error recving on channel: %s\n",uVar4);
      abort();
    }
    goto LAB_001a9b61;
  }
  fprintf(_stderr,"got %d bytes\n",(ulong)__n & 0xffffffff);
  auStack_70._0_8_ = (long *)0x1;
  iVar2 = uv_pipe_pending_count(ppcVar5);
  if ((long *)auStack_70._0_8_ == (long *)(long)iVar2) {
    uVar3 = uv_pipe_pending_type(ppcVar5);
    auStack_70._0_8_ = __n;
    if ((long)__n < 1) goto LAB_001a9d76;
    if (*extraout_RDX == 0) goto LAB_001a9d83;
    auStack_70._0_8_ = ZEXT48(uVar3);
    if ((long *)auStack_70._0_8_ == (long *)0x0) goto LAB_001a9d88;
    read_cb_called = read_cb_called + 1;
    if ((long *)auStack_70._0_8_ != (long *)0xc) goto LAB_001a9d95;
    uVar4 = uv_default_loop();
    iVar2 = uv_tcp_init(uVar4,&tcp_connection);
    auStack_70._0_8_ = SEXT48(iVar2);
    if ((long *)auStack_70._0_8_ != (long *)0x0) goto LAB_001a9da2;
    iVar2 = uv_accept(ppcVar5,&tcp_connection);
    auStack_70._0_8_ = SEXT48(iVar2);
    if ((long *)auStack_70._0_8_ == (long *)0x0) {
      iVar2 = bcmp("hello\n",(void *)*extraout_RDX,(size_t)__n);
      if (iVar2 == 0) {
        auStack_70 = uv_buf_init("world\n",6);
        iVar2 = uv_write(&write_req,&tcp_connection,auStack_70,1,on_tcp_write);
        uStack_60 = 0;
        if (iVar2 != 0) {
          on_read_connection_cold_6();
          run_ipc_test("ipc_helper_send_zero",on_read_send_zero);
          return 0;
        }
        iVar2 = uv_read_start(&tcp_connection,on_read_alloc,on_tcp_read);
        uStack_60 = 0;
        if (iVar2 != 0) {
          on_read_connection_cold_7();
          goto LAB_001a9d4b;
        }
        goto LAB_001a9b61;
      }
      goto LAB_001a9dbc;
    }
  }
  else {
    on_read_connection_cold_1();
LAB_001a9d76:
    on_read_connection_cold_2();
LAB_001a9d83:
    on_read_connection_cold_9();
LAB_001a9d88:
    on_read_connection_cold_8();
LAB_001a9d95:
    on_read_connection_cold_3();
LAB_001a9da2:
    on_read_connection_cold_4();
  }
  on_read_connection_cold_5();
LAB_001a9dbc:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
          ,0x18a,"\"hello\\n\"");
  abort();
}

Assistant:

TEST_IMPL(ipc_listen_after_write) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_listen_after_write", on_read);
  ASSERT_EQ(1, local_conn_accepted);
  ASSERT_EQ(1, remote_conn_accepted);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, exit_cb_called);
  return r;
}